

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

UAmbiguousConverter * ucnv_getAmbiguous(UConverter *cnv)

{
  long lVar1;
  uint in_EAX;
  int iVar2;
  char *__s1;
  long lVar3;
  UAmbiguousConverter *pUVar4;
  UErrorCode errorCode;
  undefined8 uStack_28;
  
  if (cnv == (UConverter *)0x0) {
    pUVar4 = (UAmbiguousConverter *)0x0;
  }
  else {
    uStack_28 = (ulong)in_EAX;
    __s1 = ucnv_getName_63(cnv,(UErrorCode *)((long)&uStack_28 + 4));
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0xc0) {
        return (UAmbiguousConverter *)0x0;
      }
      iVar2 = strcmp(__s1,*(char **)((long)&ambiguousConverters[0].name + lVar3));
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    pUVar4 = (UAmbiguousConverter *)((long)&ambiguousConverters[0].name + lVar3);
  }
  return pUVar4;
}

Assistant:

static const UAmbiguousConverter *ucnv_getAmbiguous(const UConverter *cnv)
{
    UErrorCode errorCode;
    const char *name;
    int32_t i;

    if(cnv==NULL) {
        return NULL;
    }

    errorCode=U_ZERO_ERROR;
    name=ucnv_getName(cnv, &errorCode);
    if(U_FAILURE(errorCode)) {
        return NULL;
    }

    for(i=0; i<UPRV_LENGTHOF(ambiguousConverters); ++i)
    {
        if(0==uprv_strcmp(name, ambiguousConverters[i].name))
        {
            return ambiguousConverters+i;
        }
    }

    return NULL;
}